

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

QStringList * __thiscall
QRegularExpression::namedCaptureGroups(QStringList *__return_storage_ptr__,QRegularExpression *this)

{
  ushort *puVar1;
  ushort uVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  bool bVar6;
  pointer pQVar7;
  uint uVar8;
  long in_FS_OFFSET;
  char16_t *local_78;
  QStringView local_70;
  QArrayDataPointer<char16_t> local_60;
  uint namedCapturingTableEntrySize;
  uint namedCapturingTableEntryCount;
  PCRE2_SPTR16 *namedCapturingTable;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = isValid(this);
  if (bVar6) {
    namedCapturingTable = (PCRE2_SPTR16 *)&DAT_aaaaaaaaaaaaaaaa;
    namedCapturingTableEntryCount = 0xaaaaaaaa;
    namedCapturingTableEntrySize = 0xaaaaaaaa;
    pcre2_pattern_info_16(((this->d).d.ptr)->compiledPattern,0x13);
    pcre2_pattern_info_16(((this->d).d.ptr)->compiledPattern,0x11,&namedCapturingTableEntryCount);
    pcre2_pattern_info_16(((this->d).d.ptr)->compiledPattern,0x12,&namedCapturingTableEntrySize);
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QString>::QList(__return_storage_ptr__,(long)((this->d).d.ptr)->capturingCount + 1);
    for (uVar8 = 0; uVar8 < namedCapturingTableEntryCount; uVar8 = uVar8 + 1) {
      puVar1 = (ushort *)
               ((long)namedCapturingTable + (ulong)(namedCapturingTableEntrySize * uVar8) * 2);
      local_78 = (char16_t *)(puVar1 + 1);
      uVar2 = *puVar1;
      QStringView::QStringView<const_char16_t_*,_true>(&local_70,&local_78);
      QStringView::toString((QString *)&local_60,&local_70);
      pQVar7 = QList<QString>::data(__return_storage_ptr__);
      pDVar3 = pQVar7[uVar2].d.d;
      pQVar7[uVar2].d.d = local_60.d;
      pcVar4 = pQVar7[uVar2].d.ptr;
      pQVar7[uVar2].d.ptr = local_60.ptr;
      qVar5 = pQVar7[uVar2].d.size;
      pQVar7[uVar2].d.size = local_60.size;
      local_60.d = pDVar3;
      local_60.ptr = pcVar4;
      local_60.size = qVar5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_003a7211:
      __stack_chk_fail();
    }
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_003a7211;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QRegularExpression::namedCaptureGroups() const
{
    if (!isValid()) // isValid() will compile the pattern
        return QStringList();

    // namedCapturingTable will point to a table of
    // namedCapturingTableEntryCount entries, each one of which
    // contains one ushort followed by the name, NUL terminated.
    // The ushort is the numerical index of the name in the pattern.
    // The length of each entry is namedCapturingTableEntrySize.
    PCRE2_SPTR16 *namedCapturingTable;
    unsigned int namedCapturingTableEntryCount;
    unsigned int namedCapturingTableEntrySize;

    pcre2_pattern_info_16(d->compiledPattern, PCRE2_INFO_NAMETABLE, &namedCapturingTable);
    pcre2_pattern_info_16(d->compiledPattern, PCRE2_INFO_NAMECOUNT, &namedCapturingTableEntryCount);
    pcre2_pattern_info_16(d->compiledPattern, PCRE2_INFO_NAMEENTRYSIZE, &namedCapturingTableEntrySize);

    // The +1 is for the implicit group #0
    QStringList result(d->capturingCount + 1);

    for (unsigned int i = 0; i < namedCapturingTableEntryCount; ++i) {
        const auto currentNamedCapturingTableRow =
                reinterpret_cast<const char16_t *>(namedCapturingTable) + namedCapturingTableEntrySize * i;

        const int index = *currentNamedCapturingTableRow;
        result[index] = QStringView(currentNamedCapturingTableRow + 1).toString();
    }

    return result;
}